

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

void discordpp::from_json(json *j,field<discordpp::MessageReference> *f)

{
  _Head_base<0UL,_discordpp::MessageReference_*,_false> _Var1;
  _Head_base<0UL,_discordpp::MessageReference_*,_false> this;
  state sVar2;
  pointer __p;
  MessageReference *local_80;
  MessageReference local_78;
  
  if (j->m_type == null) {
    _Var1._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
         ._M_t.
         super__Tuple_impl<0UL,_discordpp::MessageReference_*,_std::default_delete<discordpp::MessageReference>_>
         .super__Head_base<0UL,_discordpp::MessageReference_*,_false>._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
    ._M_t.
    super__Tuple_impl<0UL,_discordpp::MessageReference_*,_std::default_delete<discordpp::MessageReference>_>
    .super__Head_base<0UL,_discordpp::MessageReference_*,_false>._M_head_impl =
         (MessageReference *)0x0;
    sVar2 = nulled_e;
    if (_Var1._M_head_impl != (MessageReference *)0x0) {
      std::default_delete<discordpp::MessageReference>::operator()
                ((default_delete<discordpp::MessageReference> *)f,_Var1._M_head_impl);
    }
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<discordpp::MessageReference,_0>(&local_78,j);
    this._M_head_impl = (MessageReference *)operator_new(0x60);
    MessageReference::MessageReference(this._M_head_impl,&local_78);
    local_80 = (MessageReference *)0x0;
    _Var1._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
         ._M_t.
         super__Tuple_impl<0UL,_discordpp::MessageReference_*,_std::default_delete<discordpp::MessageReference>_>
         .super__Head_base<0UL,_discordpp::MessageReference_*,_false>._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
    ._M_t.
    super__Tuple_impl<0UL,_discordpp::MessageReference_*,_std::default_delete<discordpp::MessageReference>_>
    .super__Head_base<0UL,_discordpp::MessageReference_*,_false>._M_head_impl = this._M_head_impl;
    if (_Var1._M_head_impl != (MessageReference *)0x0) {
      std::default_delete<discordpp::MessageReference>::operator()
                ((default_delete<discordpp::MessageReference> *)f,_Var1._M_head_impl);
    }
    if (local_80 != (MessageReference *)0x0) {
      std::default_delete<discordpp::MessageReference>::operator()
                ((default_delete<discordpp::MessageReference> *)&local_80,local_80);
    }
    local_80 = (MessageReference *)0x0;
    if (local_78.fail_if_not_exists.super_field<bool>.t_._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0) {
      operator_delete((void *)local_78.fail_if_not_exists.super_field<bool>.t_._M_t.
                              super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                              super__Head_base<0UL,_bool_*,_false>._M_head_impl,1);
    }
    local_78.fail_if_not_exists.super_field<bool>.t_._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool>,_true,_true>)
                   (__uniq_ptr_impl<bool,_std::default_delete<bool>_>)0x0;
    if ((tuple<discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)
        local_78.guild_id.super_field<discordpp::Snowflake>.t_._M_t.
        super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t
        .super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
        super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl !=
        (_Head_base<0UL,_discordpp::Snowflake_*,_false>)0x0) {
      operator_delete((void *)local_78.guild_id.super_field<discordpp::Snowflake>.t_._M_t.
                              super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
                              .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl,8);
    }
    local_78.guild_id.super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
         (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
          )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
    if ((_Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)
        local_78.channel_id.super_field<discordpp::Snowflake>.t_._M_t.
        super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t
        .super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
        super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl != (Snowflake *)0x0) {
      operator_delete((void *)local_78.channel_id.super_field<discordpp::Snowflake>.t_._M_t.
                              super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
                              .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl,8);
    }
    local_78.channel_id.super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
         (__uniq_ptr_data<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>,_true,_true>
          )(__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>)0x0;
    if ((_Head_base<0UL,_discordpp::Snowflake_*,_false>)
        local_78.message_id.super_field<discordpp::Snowflake>.t_._M_t.
        super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t
        .super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
        super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl !=
        (_Head_base<0UL,_discordpp::Snowflake_*,_false>)0x0) {
      operator_delete((void *)local_78.message_id.super_field<discordpp::Snowflake>.t_._M_t.
                              super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
                              .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl,8);
    }
    sVar2 = present_e;
  }
  f->s_ = sVar2;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }